

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void vdbeFreeOpArray(sqlite3 *db,Op *aOp,int nOp)

{
  Op *pOVar1;
  Op *pOVar2;
  
  if (aOp == (Op *)0x0) {
    return;
  }
  pOVar2 = aOp + nOp;
  while (pOVar1 = pOVar2, pOVar2 = pOVar1 + -1, aOp <= pOVar2) {
    if (pOVar1[-1].p4type < -6) {
      freeP4(db,(int)pOVar1[-1].p4type,pOVar1[-1].p4.p);
    }
  }
  sqlite3DbFreeNN(db,aOp);
  return;
}

Assistant:

static void vdbeFreeOpArray(sqlite3 *db, Op *aOp, int nOp){
  if( aOp ){
    Op *pOp;
    for(pOp=&aOp[nOp-1]; pOp>=aOp; pOp--){
      if( pOp->p4type <= P4_FREE_IF_LE ) freeP4(db, pOp->p4type, pOp->p4.p);
#ifdef SQLITE_ENABLE_EXPLAIN_COMMENTS
      sqlite3DbFree(db, pOp->zComment);
#endif     
    }
    sqlite3DbFreeNN(db, aOp);
  }
}